

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

json_token * __thiscall
mjs::anon_unknown_46::json_lexer::next_token(json_token *__return_storage_ptr__,json_lexer *this)

{
  ulong uVar1;
  ulong pos;
  pointer pwVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  wostream *pwVar7;
  native_error_exception *pnVar8;
  global_object *pgVar9;
  wstring_view *s_00;
  wstring_view *s_01;
  ulong uVar10;
  wstring *text;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  wchar_t wVar14;
  ulong local_258;
  wstring *local_250;
  anon_class_24_3_fd8a6a9b decimal_digits;
  wstring_view local_228;
  anon_class_16_2_032a7d33 invalid;
  json_lexer *local_1f8;
  size_t start;
  size_type len;
  wstring s;
  wstring_view local_1b8;
  wostringstream woss;
  wstring local_1a0;
  ulong local_180;
  
  uVar1 = (this->text_)._M_string_length;
  pos = this->pos_;
  len = uVar1;
  if (uVar1 <= pos) {
    _woss = eof;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_local_buf[0] = L'\0';
    local_180 = pos;
    json_token::operator=(&this->tok_,(json_token *)&woss);
    std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
    goto LAB_0013d865;
  }
  pwVar2 = (this->text_)._M_dataplus._M_p;
  wVar14 = pwVar2[pos];
  uVar13 = wVar14 & 0xffff;
  uVar11 = pos + 1;
  this->pos_ = uVar11;
  uVar12 = (ushort)wVar14;
  start = pos;
  if ((uVar12 < 0x21) && ((0x100002600U >> ((ulong)uVar13 & 0x3f) & 1) != 0)) {
    while (((uVar10 = uVar1, uVar11 < uVar1 &&
            (uVar6 = (ulong)(ushort)pwVar2[uVar11], uVar10 = uVar11, uVar6 < 0x21)) &&
           ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0))) {
      uVar11 = uVar11 + 1;
    }
    _woss = whitespace;
    uVar11 = uVar10;
LAB_0013d840:
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    local_1a0.field_2._M_local_buf[0] = L'\0';
    local_1a0._M_string_length = 0;
    local_258 = uVar11;
    local_180 = pos;
    json_token::operator=(&this->tok_,(json_token *)&woss);
    std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
  }
  else {
    if (uVar12 == 0x2c) {
      _woss = comma;
      goto LAB_0013d840;
    }
    local_250 = &this->text_;
    local_258 = uVar11;
    if (uVar13 != 0x2d) {
      if (uVar13 == 0x3a) {
        _woss = colon;
      }
      else if (uVar13 == 0x7d) {
        _woss = rbrace;
      }
      else {
        if (uVar13 != 0x5d) {
          if (uVar13 == 0x66) {
            iVar5 = std::__cxx11::wstring::compare((ulong)local_250,uVar11,(wchar_t *)0x4);
            if (iVar5 == 0) {
              _woss = false_;
              uVar11 = pos + 5;
              goto LAB_0013dcfc;
            }
          }
          else if (uVar13 == 0x6e) {
            iVar5 = std::__cxx11::wstring::compare((ulong)local_250,uVar11,(wchar_t *)0x3);
            if (iVar5 == 0) {
              _woss = null;
LAB_0013d996:
              uVar11 = pos + 4;
              goto LAB_0013dcfc;
            }
          }
          else {
            if (uVar13 != 0x74) {
              if (uVar13 == 0x7b) {
                _woss = lbrace;
              }
              else {
                if (uVar13 != 0x5b) {
                  bVar4 = true;
                  if ((ushort)(uVar12 - 0x30) < 10) goto LAB_0013d9d7;
                  goto LAB_0013db24;
                }
                _woss = lbracket;
              }
LAB_0013dcfc:
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              local_1a0.field_2._M_local_buf[0] = L'\0';
              local_1a0._M_string_length = 0;
              text = &local_1a0;
              local_258 = uVar11;
              local_180 = pos;
              json_token::operator=(&this->tok_,(json_token *)&woss);
LAB_0013dd14:
              std::__cxx11::wstring::~wstring((wstring *)text);
              goto LAB_0013d85d;
            }
            iVar5 = std::__cxx11::wstring::compare((ulong)local_250,uVar11,(wchar_t *)0x3);
            if (iVar5 == 0) {
              _woss = true_;
              goto LAB_0013d996;
            }
          }
LAB_0013db24:
          local_1f8 = this;
          if (uVar13 == 0x22) {
            s._M_dataplus._M_p = (pointer)&s.field_2;
            s._M_string_length = 0;
            s.field_2._M_local_buf[0] = L'\0';
            bVar4 = false;
            uVar10 = uVar11;
LAB_0013db49:
            if (uVar10 == uVar1) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
              pwVar7 = std::operator<<((wostream *)&woss,"Unterminated string in JSON at position ")
              ;
              std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
              global_object::stack_trace_abi_cxx11_((wstring *)&decimal_digits,pgVar9);
              local_228._M_len = (size_t)decimal_digits.len;
              local_228._M_str = (wchar_t *)decimal_digits.end;
              std::__cxx11::wstringbuf::str();
              local_1b8._M_len = (size_t)invalid.this;
              local_1b8._M_str = (wchar_t *)invalid.start;
              native_error_exception::native_error_exception(pnVar8,syntax,&local_228,&local_1b8);
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            }
            uVar11 = uVar10 + 1;
            pwVar2 = (local_250->_M_dataplus)._M_p;
            uVar12 = (ushort)pwVar2[uVar10];
            wVar14 = (wchar_t)uVar12;
            local_258 = uVar11;
            if (!bVar4) goto LAB_0013dbb2;
            if (uVar11 == uVar1) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
              pwVar7 = std::operator<<((wostream *)&woss,
                                       "Unterminated escape sequence in JSON at position ");
              std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
              global_object::stack_trace_abi_cxx11_((wstring *)&decimal_digits,pgVar9);
              local_228._M_len = (size_t)decimal_digits.len;
              local_228._M_str = (wchar_t *)decimal_digits.end;
              std::__cxx11::wstringbuf::str();
              local_1b8._M_len = (size_t)invalid.this;
              local_1b8._M_str = (wchar_t *)invalid.start;
              native_error_exception::native_error_exception(pnVar8,syntax,&local_228,&local_1b8);
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            }
            switch(uVar12) {
            case 0x6e:
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
switchD_0013dbd9_caseD_6f:
              std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
              pwVar7 = std::operator<<((wostream *)&woss,"Invalid escape sequence \"\\");
              pwVar7 = std::operator<<(pwVar7,wVar14);
              pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
              std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
              pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
              pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
              global_object::stack_trace_abi_cxx11_((wstring *)&decimal_digits,pgVar9);
              local_228._M_len = (size_t)decimal_digits.len;
              local_228._M_str = (wchar_t *)decimal_digits.end;
              std::__cxx11::wstringbuf::str();
              local_1b8._M_len = (size_t)invalid.this;
              local_1b8._M_str = (wchar_t *)invalid.start;
              native_error_exception::native_error_exception(pnVar8,syntax,&local_228,&local_1b8);
              __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                          native_error_exception::~native_error_exception);
            case 0x72:
              break;
            case 0x74:
              break;
            case 0x75:
              if (uVar1 < uVar10 + 6) {
                std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
                pwVar7 = std::operator<<((wostream *)&woss,
                                         "Unterminated escape sequence in JSON at position ");
                std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
                pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
                pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
                global_object::stack_trace_abi_cxx11_((wstring *)&decimal_digits,pgVar9);
                local_228._M_len = (size_t)decimal_digits.len;
                local_228._M_str = (wchar_t *)decimal_digits.end;
                std::__cxx11::wstringbuf::str();
                local_1b8._M_len = (size_t)invalid.this;
                local_1b8._M_str = (wchar_t *)invalid.start;
                native_error_exception::native_error_exception(pnVar8,syntax,&local_228,&local_1b8);
                __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                            native_error_exception::~native_error_exception);
              }
              get_hex_value4(pwVar2 + uVar11);
              std::__cxx11::wstring::push_back((wchar_t)&s);
              uVar10 = uVar10 + 5;
              bVar4 = false;
              local_258 = uVar10;
              goto LAB_0013db49;
            default:
              if ((((wVar14 != L'\"') && (wVar14 != L'/')) && (wVar14 != L'\\')) &&
                 ((wVar14 != L'f' && (wVar14 != L'b')))) goto switchD_0013dbd9_caseD_6f;
            }
LAB_0013dc25:
            bVar4 = false;
            std::__cxx11::wstring::push_back((wchar_t)&s);
            uVar10 = uVar11;
            goto LAB_0013db49;
          }
          goto LAB_0013e15b;
        }
        _woss = rbracket;
      }
      goto LAB_0013d840;
    }
    bVar4 = false;
LAB_0013d9d7:
    invalid.start = &start;
    decimal_digits.len = &len;
    decimal_digits.end = &local_258;
    decimal_digits.this = this;
    invalid.this = this;
    bVar3 = next_token::anon_class_24_3_fd8a6a9b::operator()(&decimal_digits);
    uVar1 = local_258;
    if (!bVar3 && !bVar4) {
LAB_0013e151:
      local_258 = uVar1;
      next_token::anon_class_16_2_032a7d33::operator()(&invalid);
LAB_0013e15b:
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
      pwVar7 = std::operator<<((wostream *)&woss,"Unexpected token \"");
      std::__cxx11::wstring::substr((ulong)&decimal_digits,(ulong)local_250);
      invalid.start = decimal_digits.len;
      invalid.this = (json_lexer *)decimal_digits.end;
      cpp_quote_abi_cxx11_(&s,(mjs *)&invalid,s_01);
      pwVar7 = std::operator<<(pwVar7,(wstring *)&s);
      pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
      std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
      std::__cxx11::wstring::~wstring((wstring *)&s);
      std::__cxx11::wstring::~wstring((wstring *)&decimal_digits);
      pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
      pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1f8);
      global_object::stack_trace_abi_cxx11_(&s,pgVar9);
      invalid.start = (size_t *)s._M_string_length;
      invalid.this = (json_lexer *)s._M_dataplus._M_p;
      std::__cxx11::wstringbuf::str();
      local_228._M_len = (size_t)decimal_digits.len;
      local_228._M_str = (wchar_t *)decimal_digits.end;
      native_error_exception::native_error_exception
                (pnVar8,syntax,(wstring_view *)&invalid,&local_228);
      __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    if ((local_258 < len) && ((local_250->_M_dataplus)._M_p[local_258] == L'.')) {
      local_258 = local_258 + 1;
      bVar4 = next_token::anon_class_24_3_fd8a6a9b::operator()(&decimal_digits);
      uVar1 = local_258;
      if (!bVar4) goto LAB_0013e151;
    }
    if ((local_258 < len) &&
       (pwVar2 = (local_250->_M_dataplus)._M_p, (pwVar2[local_258] | 0x20U) == 0x65)) {
      uVar1 = local_258 + 1;
      if (uVar1 != len) {
        wVar14 = pwVar2[local_258 + 1];
        if ((wVar14 == L'-') || (wVar14 == L'+')) {
          uVar1 = local_258 + 2;
        }
        local_258 = uVar1;
        bVar4 = next_token::anon_class_24_3_fd8a6a9b::operator()(&decimal_digits);
        uVar1 = local_258;
        if (bVar4) goto LAB_0013daa3;
      }
      goto LAB_0013e151;
    }
LAB_0013daa3:
    std::__cxx11::wstring::substr((ulong)&s,(ulong)local_250);
    json_token::json_token((json_token *)&woss,number,&s,start);
    json_token::operator=(&this->tok_,(json_token *)&woss);
    std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
    std::__cxx11::wstring::~wstring((wstring *)&s);
    uVar11 = local_258;
  }
LAB_0013d85d:
  this->pos_ = uVar11;
LAB_0013d865:
  json_token::json_token(__return_storage_ptr__,&this->tok_);
  return __return_storage_ptr__;
LAB_0013dbb2:
  bVar4 = true;
  uVar10 = uVar11;
  if (wVar14 == L'\\') goto LAB_0013db49;
  if (wVar14 == L'\"') {
    text = &s;
    json_token::json_token((json_token *)&woss,string,text,pos);
    json_token::operator=(&this->tok_,(json_token *)&woss);
    std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
    goto LAB_0013dd14;
  }
  if ((uint)wVar14 < 0x20) {
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
    pwVar7 = std::operator<<((wostream *)&woss,"Invalid character \"");
    std::__cxx11::wstring::substr((ulong)&invalid,(ulong)local_250);
    local_228._M_len = (size_t)invalid.this;
    local_228._M_str = (wchar_t *)invalid.start;
    cpp_quote_abi_cxx11_((wstring *)&decimal_digits,(mjs *)&local_228,s_00);
    pwVar7 = std::operator<<(pwVar7,(wstring *)&decimal_digits);
    pwVar7 = std::operator<<(pwVar7,"\" in JSON at position ");
    std::wostream::_M_insert<unsigned_long>((ulong)pwVar7);
    std::__cxx11::wstring::~wstring((wstring *)&decimal_digits);
    std::__cxx11::wstring::~wstring((wstring *)&invalid);
    pnVar8 = (native_error_exception *)__cxa_allocate_exception(0x58);
    pgVar9 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
    global_object::stack_trace_abi_cxx11_((wstring *)&decimal_digits,pgVar9);
    local_228._M_len = (size_t)decimal_digits.len;
    local_228._M_str = (wchar_t *)decimal_digits.end;
    std::__cxx11::wstringbuf::str();
    local_1b8._M_len = (size_t)invalid.this;
    local_1b8._M_str = (wchar_t *)invalid.start;
    native_error_exception::native_error_exception(pnVar8,syntax,&local_228,&local_1b8);
    __cxa_throw(pnVar8,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  goto LAB_0013dc25;
}

Assistant:

json_token next_token() {
        const auto len = text_.length();
        if (pos_ >= len) {
            tok_ = json_token{json_token_type::eof, pos_};
            return tok_;
        }

        const auto start = pos_;
        const char16_t ch = text_[pos_];
        auto end = ++pos_;

        if (json_is_whitespace(ch)) {
            while (end < len && json_is_whitespace(text_[end])) {
                ++end;
            }
            tok_ = json_token{json_token_type::whitespace, start};
        } else if (ch == '[') {
            tok_ = json_token{json_token_type::lbracket, start};
        } else if (ch == ']') {
            tok_ = json_token{json_token_type::rbracket, start};
        } else if (ch == '{') {
            tok_ = json_token{json_token_type::lbrace, start};
        } else if (ch == '}') {
            tok_ = json_token{json_token_type::rbrace, start};
        } else if (ch == ',') {
            tok_ = json_token{json_token_type::comma, start};
        } else if (ch == ':') {
            tok_ = json_token{json_token_type::colon, start};
        } else if (ch == 'n' && text_.compare(end, 3, L"ull") == 0) {
            end += 3;
            tok_ = json_token{json_token_type::null, start};
        } else if (ch == 'f' && text_.compare(end, 4, L"alse") == 0) {
            end += 4;
            tok_ = json_token{json_token_type::false_, start};
        } else if (ch == 't' && text_.compare(end, 3, L"rue") == 0) {
            end += 3;
            tok_ = json_token{json_token_type::true_, start};
        } else if (ch == '-' || json_is_digit(ch)) {
            auto invalid = [&]() {
                std::wostringstream woss;
                woss << "Invalid number in JSON at position " << start;
                throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
            };
            auto decimal_digits = [&]() {
                bool any = false;
                while (end < len && isdigit(text_[end])) {
                    any = true;
                    ++end;
                }
                return any;
            };
            if (!decimal_digits() && ch == '-') {
                invalid();
            }
            if (end < len && text_[end] == '.') {
                ++end;
                if (!decimal_digits()) {
                    invalid();
                }
            }
            if (end < len && (text_[end] == 'e' || text_[end] == 'E')) {
                ++end;
                if (end == len) {
                    invalid();
                }
                if (text_[end] == '-' || text_[end] == '+') {
                    ++end;
                }
                if (!decimal_digits()) {
                    invalid();
                }
            }
            tok_ = json_token{json_token_type::number, text_.substr(start, end-start), start};
        } else if (ch == '"') {
            std::wstring s;
            for (bool escape = false;;) {
                if (end == len) {
                    std::wostringstream woss;
                    woss << "Unterminated string in JSON at position " << start;
                    throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                }
                const char16_t sch = text_[end++];
                if (escape) {
                    if (end == len) {
                        std::wostringstream woss;
                        woss << "Unterminated escape sequence in JSON at position " << end-1;
                        throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                    }
                    switch (sch) {
                    case '"': [[fallthrough]];
                    case '/': [[fallthrough]];
                    case '\\':
                        s.push_back(sch);
                        break;
                    case 'b': s.push_back(8); break;
                    case 'f': s.push_back(12); break;
                    case 'n': s.push_back(10); break;
                    case 'r': s.push_back(13); break;
                    case 't': s.push_back(9); break;
                    case 'u':
                        if (end + 5 > len) {
                            std::wostringstream woss;
                            woss << "Unterminated escape sequence in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                        try {
                            s.push_back(static_cast<char16_t>(get_hex_value4(&text_[end])));
                        } catch (const std::runtime_error&) {
                            std::wostringstream woss;
                            woss << "Invalid escape sequence in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                        end+=4;
                        break;
                    default:
                        {
                            std::wostringstream woss;
                            woss << "Invalid escape sequence \"\\" << (wchar_t)sch << "\" in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                    }
                    escape = false;
                } else if (sch == '"') {
                    break;
                } else if (sch == '\\') {
                    escape = true;
                } else if (sch < 0x20) {
                    std::wostringstream woss;
                    woss << "Invalid character \"" << cpp_quote(text_.substr(end - 1, 1)) << "\" in JSON at position " << end - 1;
                    throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                } else {
                    s.push_back(sch);
                }
            }
            tok_ = json_token{json_token_type::string, std::move(s), start};
        } else {
            std::wostringstream woss;
            woss << "Unexpected token \"" << cpp_quote(text_.substr(start, 1)) << "\" in JSON at position " << start;
            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
        }

        pos_ = end;
        return tok_;
    }